

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5efc::TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing::RunImpl
          (TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  ScopedCurrentTest scopedResults;
  float data [2] [2];
  TestResults testResults;
  float local_74;
  float **local_70;
  ScopedCurrentTest local_68;
  TestDetails local_58;
  float local_38 [2];
  float afStack_30 [2];
  TestResults local_28;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults(&local_28,(TestReporter *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  local_68.m_oldTestResults = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  local_68.m_oldTestDetails = *ppTVar3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &local_28;
  local_38[0] = 0.0;
  local_38[1] = 1.0;
  afStack_30[0] = 3.0;
  afStack_30[1] = 3.0;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  (anonymous_namespace)::g_sideEffect = (anonymous_namespace)::g_sideEffect + 1;
  local_70 = (float **)(anonymous_namespace)::FunctionWithSideEffects3()::data;
  local_74 = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x31c);
  UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
            (pTVar1,(float (*) [2] [2])local_38,&local_70,2,2,&local_74,&local_58);
  ScopedCurrentTest::~ScopedCurrentTest(&local_68);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_28.m_testReporter._0_4_ = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar3,0x31e);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&local_28,&(anonymous_namespace)::g_sideEffect,&local_58);
  return;
}

Assistant:

TEST(CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data, FunctionWithSideEffects3(), 2, 2, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}